

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall
ast::RangeExpr::toString_abi_cxx11_(string *__return_storage_ptr__,RangeExpr *this)

{
  string local_1e0;
  string local_1b0;
  ostringstream local_190 [8];
  ostringstream msg;
  RangeExpr *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__cxx11::to_string(&local_1b0,this->init_value);
  std::operator<<((ostream *)local_190,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::operator<<((ostream *)local_190,"..");
  std::__cxx11::to_string(&local_1e0,this->end_value);
  std::operator<<((ostream *)local_190,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::RangeExpr::toString() const {
    std::ostringstream msg;
    msg << std::to_string(init_value);
    msg << "..";
    msg << std::to_string(end_value);
    return msg.str();
}